

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O0

int phits2mcpl2(char *phitsdumpfile,char *mcplfile,int opt_dp,int opt_gzip,char *inputdeckfile,
               char *dumpsummaryfile)

{
  phits_file_t ff;
  phits_file_t ff_00;
  int iVar1;
  char *pcVar2;
  double *pdVar3;
  phits_particle_t *ppVar4;
  size_t sVar5;
  void *__dest;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  long in_R8;
  long in_R9;
  int did_gzip;
  char *actual_filename;
  size_t laf;
  char *tmp;
  phits_particle_t *p;
  mcpl_particle_t *mcpl_particle;
  uint64_t summaryfile_lbuf;
  char *summaryfile_buf;
  uint64_t cfgfile_lbuf;
  char *cfgfile_buf;
  mcpl_outfile_t mcplfh;
  phits_file_t f;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  phits_file_t in_stack_ffffffffffffff88;
  ulong local_60;
  char *local_58;
  ulong local_50;
  char *local_48;
  undefined8 local_40;
  void *local_38;
  long local_30;
  long local_28;
  int local_20;
  int local_1c;
  undefined8 local_18;
  int local_4;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_38 = (void *)phits_open_file(in_stack_ffffffffffffff68);
  local_40 = mcpl_create_outfile(local_18);
  mcpl_hdr_set_srcname(local_40,"PHITS");
  mcpl_hdr_add_comment(local_40,"Converted from PHITS with phits2mcpl");
  if (local_1c != 0) {
    mcpl_enable_doubleprec(local_40);
  }
  ff.internal._4_4_ = in_stack_ffffffffffffff74;
  ff.internal._0_4_ = in_stack_ffffffffffffff70;
  iVar1 = phits_has_polarisation(ff);
  if (iVar1 != 0) {
    mcpl_enable_polarisation(local_40);
  }
  if (local_28 != 0) {
    mcpl_read_file_to_buffer(local_28,0x6400000,1,&local_50,&local_48);
    pcVar2 = strstr(local_48,"dump");
    if (pcVar2 == (char *)0x0) {
      printf("Error: specified configuration file %s looks invalid as it does not contain the word \"dump\".\n"
             ,local_28);
      return 0;
    }
    mcpl_hdr_add_data(local_40,"phits_input_deck",local_50 & 0xffffffff,local_48);
    free(local_48);
  }
  if (local_30 != 0) {
    mcpl_read_file_to_buffer(local_30,0x6400000,1,&local_60,&local_58);
    pcVar2 = strstr(local_58,"dump");
    if (pcVar2 == (char *)0x0) {
      printf("Error: specified dump summary file %s looks invalid as it does not contain the word \"dump\".\n"
             ,local_30);
      return 0;
    }
    mcpl_hdr_add_data(local_40,"phits_dump_summary_file",local_60 & 0xffffffff,local_58);
    free(local_58);
  }
  pdVar3 = (double *)mcpl_get_empty_particle(local_40);
  while (ppVar4 = phits_load_particle(in_stack_ffffffffffffff88), ppVar4 != (phits_particle_t *)0x0)
  {
    if (ppVar4->pdgcode == 0) {
      printf("Warning: ignored particle with no PDG code set (raw phits kt code was %li).\n",
             ppVar4->rawtype);
    }
    else {
      *(int *)(pdVar3 + 0xc) = (int)ppVar4->pdgcode;
      pdVar3[4] = ppVar4->x;
      pdVar3[5] = ppVar4->y;
      pdVar3[6] = ppVar4->z;
      pdVar3[7] = ppVar4->dirx;
      pdVar3[8] = ppVar4->diry;
      pdVar3[9] = ppVar4->dirz;
      pdVar3[1] = ppVar4->polx;
      pdVar3[2] = ppVar4->poly;
      pdVar3[3] = ppVar4->polz;
      pdVar3[10] = ppVar4->time * 1e-06;
      pdVar3[0xb] = ppVar4->weight;
      *pdVar3 = ppVar4->ekin;
      mcpl_add_particle(local_40,pdVar3);
    }
  }
  pcVar2 = (char *)mcpl_outfile_filename(local_40);
  sVar5 = strlen(pcVar2);
  __dest = malloc(sVar5 + 1);
  if (__dest == (void *)0x0) {
    printf("Error: Memory allocation error\n");
    local_4 = 0;
  }
  else {
    memcpy(__dest,pcVar2,sVar5 + 1);
    iVar1 = 0;
    if (local_20 == 0) {
      mcpl_close_outfile(local_40);
    }
    else {
      iVar1 = mcpl_closeandgzip_outfile(local_40);
    }
    ff_00.internal._4_4_ = iVar1;
    ff_00.internal._0_4_ = in_stack_ffffffffffffff70;
    phits_close_file(ff_00);
    pcVar2 = "";
    if (iVar1 != 0) {
      pcVar2 = ".gz";
    }
    printf("Created %s%s\n",__dest,pcVar2);
    free(__dest);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int phits2mcpl2( const char * phitsdumpfile, const char * mcplfile,
                 int opt_dp, int opt_gzip,
                 const char * inputdeckfile,
                 const char * dumpsummaryfile )
{
  phits_file_t f = phits_open_file(phitsdumpfile);
  mcpl_outfile_t mcplfh = mcpl_create_outfile(mcplfile);

  mcpl_hdr_set_srcname(mcplfh,"PHITS");
  mcpl_hdr_add_comment(mcplfh,"Converted from PHITS with phits2mcpl");

  if (opt_dp)
    mcpl_enable_doubleprec(mcplfh);

  if (phits_has_polarisation(f))
    mcpl_enable_polarisation(mcplfh);

  if (inputdeckfile) {
    char* cfgfile_buf;
    uint64_t cfgfile_lbuf;
    mcpl_read_file_to_buffer( inputdeckfile,
                              104857600,//100mb max
                              1,//text
                              &cfgfile_lbuf,
                              &cfgfile_buf );

    //We won't do much for sanity checks since we want to avoid the risk of
    //false positives, but at least the word "dump" should occur in both input
    //deck and dump summary files:
    if (!strstr((const char*)cfgfile_buf, "dump")) {
      printf("Error: specified configuration file %s looks invalid as it"
             " does not contain the word \"dump\".\n",inputdeckfile);
      return 0;
    }
    mcpl_hdr_add_data( mcplfh,
                       "phits_input_deck",
                       (uint32_t)cfgfile_lbuf,
                       (const char *)cfgfile_buf );
    free(cfgfile_buf);
  }
  if (dumpsummaryfile) {
    char* summaryfile_buf;
    uint64_t summaryfile_lbuf;
    mcpl_read_file_to_buffer( dumpsummaryfile,
                              104857600,//100mb max
                              1,//text
                              &summaryfile_lbuf,
                              &summaryfile_buf );

    //Same check as for the input deck above:
    if (!strstr(summaryfile_buf, "dump")) {
      printf("Error: specified dump summary file %s looks invalid"
             " as it does not contain the word \"dump\".\n",dumpsummaryfile);
      return 0;
    }
    mcpl_hdr_add_data( mcplfh,
                       "phits_dump_summary_file",
                       (uint32_t)summaryfile_lbuf,
                       summaryfile_buf );
    free(summaryfile_buf);
  }

  mcpl_particle_t* mcpl_particle = mcpl_get_empty_particle(mcplfh);

  while ( 1 ) {
    const phits_particle_t * p = phits_load_particle(f);
    if (!p)
      break;

    if (!p->pdgcode) {
      printf("Warning: ignored particle with no PDG code set (raw phits kt"
             " code was %li).\n",p->rawtype);
      continue;
    }
    mcpl_particle->pdgcode = p->pdgcode;
    mcpl_particle->position[0] = p->x;//already in cm
    mcpl_particle->position[1] = p->y;//already in cm
    mcpl_particle->position[2] = p->z;//already in cm
    mcpl_particle->direction[0] = p->dirx;
    mcpl_particle->direction[1] = p->diry;
    mcpl_particle->direction[2] = p->dirz;
    mcpl_particle->polarisation[0] = p->polx;
    mcpl_particle->polarisation[1] = p->poly;
    mcpl_particle->polarisation[2] = p->polz;
    mcpl_particle->time = p->time * 1.0e-6;//nanoseconds (PHITS) to milliseconds
                                           //(MCPL)
    mcpl_particle->weight = p->weight;
    mcpl_particle->ekin = p->ekin;//already in MeV
    mcpl_add_particle(mcplfh,mcpl_particle);
  }

  const char * tmp = mcpl_outfile_filename(mcplfh);
  size_t laf = strlen(tmp);
  char * actual_filename = malloc(laf+1);
  if (!actual_filename) {
    printf("Error: Memory allocation error\n");
    return 0;
  }
  memcpy(actual_filename,tmp,laf+1);

  int did_gzip = 0;
  if (opt_gzip)
    did_gzip = mcpl_closeandgzip_outfile(mcplfh);
  else
    mcpl_close_outfile(mcplfh);
  phits_close_file(f);

  printf("Created %s%s\n",actual_filename,(did_gzip?".gz":""));
  free(actual_filename);
  return 1;
}